

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O1

int GetFrameSBG(SBG *pSBG,SBGDATA *pSBGData)

{
  ulong uVar1;
  ulong uVar2;
  SBG *pSBG_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  ssize_t sVar6;
  __time_t _Var7;
  uint uVar8;
  int framelen;
  long *plVar9;
  ushort uVar10;
  ulong uVar11;
  long lVar12;
  size_t __n;
  uint uVar13;
  ulong uVar14;
  char cVar15;
  int iVar16;
  uint uVar17;
  uchar *frame;
  CHRONO chrono;
  uchar recvbuf [8192];
  uint local_20ac;
  timespec local_20a8;
  SBG *local_2098;
  ulong local_2090;
  SBGDATA *local_2088;
  timespec local_2080;
  undefined8 local_2070;
  undefined8 uStack_2068;
  long local_2060;
  long lStack_2058;
  timespec local_2050;
  int local_2040;
  uchar local_2038 [8200];
  
  iVar3 = clock_getres(4,&local_2050);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_2080), iVar3 == 0)) {
    local_2040 = 0;
    local_2070 = 0;
    uStack_2068 = 0;
    local_2060 = 0;
    lStack_2058 = 0;
  }
  uVar14 = 0;
  memset(local_2038,0,0x2000);
  iVar3 = (pSBG->RS232Port).DevType;
  if (iVar3 - 1U < 4) {
    iVar3 = (pSBG->RS232Port).s;
    do {
      sVar6 = recv(iVar3,local_2038 + uVar14,(long)(9 - (int)uVar14),0);
      if ((int)sVar6 < 1) goto LAB_001a61ae;
      uVar13 = (int)uVar14 + (int)sVar6;
      uVar14 = (ulong)uVar13;
    } while ((int)uVar13 < 9);
  }
  else {
    if (iVar3 != 0) {
LAB_001a61ae:
      puts("Error reading data from a SBG. ");
      return 1;
    }
    iVar3 = *(int *)&(pSBG->RS232Port).hDev;
    uVar14 = 0;
    do {
      sVar6 = read(iVar3,local_2038 + uVar14,(ulong)(9 - (int)uVar14));
      if ((int)sVar6 < 1) goto LAB_001a61ae;
      uVar13 = (int)uVar14 + (int)sVar6;
      uVar14 = (ulong)uVar13;
    } while (uVar13 < 9);
  }
  local_2088 = pSBGData;
  iVar3 = 9;
  local_2090 = 0;
  local_20ac = 0;
  local_2098 = pSBG;
  do {
    uVar13 = 0;
    frame = local_2038;
    do {
      iVar4 = iVar3 - uVar13;
      if (iVar4 < 9) {
        uVar8 = 9 - iVar4;
        framelen = 0;
LAB_001a5ec9:
        iVar16 = 6;
        uVar5 = 0;
      }
      else {
        iVar16 = 1;
        uVar8 = 0xffffffff;
        framelen = 0;
        if ((*frame == 0xff) && (frame[1] == 'Z')) {
          local_2090 = (ulong)frame[2];
          local_20ac = (uint)frame[3];
          lVar12 = (ulong)*(ushort *)(frame + 4) + 9;
          framelen = (int)lVar12;
          uVar8 = framelen - iVar4;
          if (uVar8 != 0 && iVar4 <= framelen) goto LAB_001a5ec9;
          uVar5 = 0;
          uVar8 = 0;
          uVar10 = (short)lVar12 - 5;
          if (uVar10 != 0) {
            uVar11 = 0;
            uVar14 = 0;
            do {
              uVar14 = (ulong)((uint)uVar14 ^ (uint)frame[uVar11 + 2]);
              cVar15 = '\b';
              do {
                uVar1 = (uVar14 & 0xffff) >> 1;
                uVar2 = uVar14 & 1;
                uVar14 = (ulong)((uint)uVar1 ^ 0xffff8408);
                if (uVar2 == 0) {
                  uVar14 = uVar1;
                }
                cVar15 = cVar15 + -1;
              } while (cVar15 != '\0');
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar10);
            uVar8 = (uint)uVar14 & 0xffff;
          }
          if (*(ushort *)(frame + (ulong)*(ushort *)(frame + 4) + 6) == uVar8) {
            uVar8 = 0xffffffff;
            iVar16 = 0;
          }
          else {
            puts("Warning : SBG CRC error. ");
            uVar5 = 2;
            uVar8 = 0xffffffff;
          }
        }
        else {
          uVar5 = 1;
        }
      }
      pSBG_00 = local_2098;
      uVar17 = 0xffffffff;
      if ((iVar16 == 0) || (uVar17 = uVar8, iVar16 == 6)) goto LAB_001a5fd1;
      frame = frame + uVar5;
      uVar13 = uVar13 + uVar5;
    } while ((int)uVar13 < iVar3);
    iVar16 = 1;
    frame = (uchar *)0x0;
    uVar17 = 0xffffffff;
LAB_001a5fd1:
    if (iVar16 == 1) {
      uVar17 = 9;
      if ((int)uVar13 < 9) {
        uVar17 = uVar13;
      }
    }
    else if (iVar16 == 0) {
      if (0 < (int)(iVar3 - (uVar13 + framelen))) {
        puts("Warning getting data from a SBG : Unexpected data after a frame. ");
      }
      iVar3 = ProcessFrameSBG(pSBG_00,frame,framelen,(int)local_2090,local_20ac,local_2088);
      return (uint)(iVar3 != 0);
    }
    __n = (size_t)(int)(iVar3 - uVar13);
    memmove(local_2038,local_2038 + (int)uVar13,__n);
    iVar3 = (iVar3 - uVar13) + uVar17;
    if (0x1fff < iVar3) {
      puts("Error reading data from a SBG : Invalid data. ");
      return 4;
    }
    iVar4 = (pSBG_00->RS232Port).DevType;
    if (iVar4 - 1U < 4) {
      if (0 < (int)uVar17) {
        iVar4 = (pSBG_00->RS232Port).s;
        uVar13 = 0;
        do {
          sVar6 = recv(iVar4,local_2038 + uVar13 + __n,(long)(int)(uVar17 - uVar13),0);
          if ((int)sVar6 < 1) goto LAB_001a61ae;
          uVar13 = uVar13 + (int)sVar6;
        } while ((int)uVar13 < (int)uVar17);
      }
    }
    else {
      if (iVar4 != 0) goto LAB_001a61ae;
      if (uVar17 != 0) {
        iVar4 = *(int *)&(pSBG_00->RS232Port).hDev;
        uVar13 = 0;
        do {
          sVar6 = read(iVar4,local_2038 + uVar13 + __n,(ulong)(uVar17 - uVar13));
          if ((int)sVar6 < 1) goto LAB_001a61ae;
          uVar13 = uVar13 + (int)sVar6;
        } while (uVar13 < uVar17);
      }
    }
    if (local_2040 == 0) {
      clock_gettime(4,&local_20a8);
      local_20a8.tv_sec =
           (local_20a8.tv_sec + local_2060 + (local_20a8.tv_nsec + lStack_2058) / 1000000000) -
           local_2080.tv_sec;
      local_20a8.tv_nsec = (local_20a8.tv_nsec + lStack_2058) % 1000000000 - local_2080.tv_nsec;
      if (local_20a8.tv_nsec < 0) {
        local_20a8.tv_sec = local_20a8.tv_sec + local_20a8.tv_nsec / 1000000000 + -1;
        local_20a8.tv_nsec = local_20a8.tv_nsec % 1000000000 + 1000000000;
      }
      plVar9 = &local_20a8.tv_nsec;
      _Var7 = local_20a8.tv_sec;
    }
    else {
      plVar9 = &lStack_2058;
      _Var7 = local_2060;
    }
    if (4.0 < (double)*plVar9 / 1000000000.0 + (double)_Var7) {
      puts("Error reading data from a SBG : Frame timeout. ");
      return 2;
    }
  } while( true );
}

Assistant:

inline int GetFrameSBG(SBG* pSBG, SBGDATA* pSBGData)
{
	unsigned char recvbuf[MAX_NB_BYTES_SBG];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	int framelen = 0;
	int mid = 0, mclass = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_SBG-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_FRAME_LEN_SBG;
	if (ReadAllRS232Port(&pSBG->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a SBG. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindFrameSBG(recvbuf, BytesReceived, &mid, &mclass, &framelen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_FRAME_LEN_SBG, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a SBG : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pSBG->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a SBG. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_SBG)
		{
			printf("Error reading data from a SBG : Frame timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-framelen > 0)
	{
		printf("Warning getting data from a SBG : Unexpected data after a frame. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *pframelen)
	//{
	//	printf("Error getting data from a SBG : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*pframelen > 0)
	//{
	//	memcpy(databuf, ptr, *pframelen);
	//}

	if (ProcessFrameSBG(pSBG, ptr, framelen, mid, mclass, pSBGData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}